

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# factor.h
# Opt level: O0

factor * __thiscall
merlin::factor::binaryOp<merlin::factor::binOpPlus>
          (factor *__return_storage_ptr__,factor *this,vsize *B)

{
  vsize *this_00;
  size_t sVar1;
  const_reference pvVar2;
  value *pvVar3;
  value b;
  value vVar4;
  ulong local_100;
  size_t i;
  subindex s2;
  subindex s1;
  undefined1 local_60 [8];
  variable_set v;
  factor *B_local;
  factor *this_local;
  factor *local_10;
  factor *F;
  
  v.m_d = B;
  local_10 = __return_storage_ptr__;
  variable_set::operator+((variable_set *)local_60,&this->v_,(variable_set *)(B + 1));
  factor(__return_storage_ptr__,(variable_set *)local_60,1.0);
  subindex::subindex((subindex *)&s2.m_subtract,(variable_set *)local_60,&this->v_);
  subindex::subindex((subindex *)&i,(variable_set *)local_60,(variable_set *)(v.m_d + 1));
  local_100 = 0;
  while (sVar1 = num_states(__return_storage_ptr__), local_100 < sVar1) {
    sVar1 = subindex::operator_cast_to_unsigned_long((subindex *)&s2.m_subtract);
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](&this->t_,sVar1);
    this_00 = v.m_d;
    vVar4 = *pvVar2;
    sVar1 = subindex::operator_cast_to_unsigned_long((subindex *)&i);
    b = operator[]((factor *)this_00,sVar1);
    vVar4 = binOpPlus::operator()((binOpPlus *)((long)&this_local + 7),vVar4,b);
    pvVar3 = operator[](__return_storage_ptr__,local_100);
    *pvVar3 = vVar4;
    local_100 = local_100 + 1;
    subindex::operator++((subindex *)&s2.m_subtract);
    subindex::operator++((subindex *)&i);
  }
  subindex::~subindex((subindex *)&i);
  subindex::~subindex((subindex *)&s2.m_subtract);
  variable_set::~variable_set((variable_set *)local_60);
  return __return_storage_ptr__;
}

Assistant:

factor binaryOp(const factor& B,
			Function Op) const {
		variable_set v = v_ + B.v_;  						// expand scope to union
		factor F(v);             					//  and create target factor
		subindex s1(v, v_), s2(v, B.v_); 	// index over A and B & do the op
		for (size_t i = 0; i < F.num_states(); ++i, ++s1, ++s2)
			F[i] = Op(t_[s1], B[s2]);
		return F; 										// return the new copy
	}